

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_test.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* readFrames_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,char *file)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  undefined1 local_258 [8];
  string line;
  long local_220;
  ifstream in;
  char *file_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::ifstream::ifstream(&local_220,file,8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Could not open \'");
    poVar3 = std::operator<<(poVar3,file);
    poVar3 = std::operator<<(poVar3,"\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string((string *)local_258);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_220,(string *)local_258);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_258);
  }
  std::__cxx11::string::~string((string *)local_258);
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> readFrames(const char* file)
{
    std::ifstream in(file);
    std::vector<std::string> result;

    if (!in)
    {
        std::cerr << "Could not open '" << file << "'" << std::endl;
    }
    std::string line;

    while (std::getline(in, line))
    {
        result.push_back(std::move(line));
    }

    return result;
}